

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O0

_Bool generate_sha2_512(uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,
                       uint8_t *additional_input,uint32_t additional_input_len)

{
  undefined8 uVar1;
  uint32_t *puVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  uint8_t *puVar6;
  _Bool _Var7;
  uint32_t len;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t **ppuVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  uint8_t auStack_250 [8];
  uint8_t *local_248;
  uint8_t *local_240;
  uint8_t *local_238;
  uint8_t *local_230;
  uint8_t *local_228;
  uint8_t *local_220;
  uint8_t *local_218;
  uint8_t *local_210;
  uint8_t *puStack_200;
  uint32_t old_ctr;
  uint8_t *k_0_2;
  unsigned_long __vla_expr7;
  uint local_1e4;
  uint8_t *puStack_1e0;
  uint32_t input_len0_2;
  uint8_t *k_;
  unsigned_long __vla_expr6;
  uint local_1c4;
  uint8_t *puStack_1c0;
  uint32_t input_len;
  uint8_t *block;
  uint8_t *puStack_1b0;
  uint32_t i;
  uint8_t *out;
  uint8_t *puStack_1a0;
  uint32_t max;
  uint8_t *output1;
  uint8_t *k_0_1;
  unsigned_long __vla_expr5;
  uint local_17c;
  uint8_t *puStack_178;
  uint32_t input_len0_1;
  uint8_t *k__2;
  unsigned_long __vla_expr4;
  uint local_15c;
  uint *puStack_158;
  uint32_t input_len_2;
  uint32_t *ctr;
  uint8_t *v;
  uint8_t *k;
  Hacl_HMAC_DRBG_state scrut;
  Hacl_HMAC_DRBG_state ite;
  EverCrypt_DRBG_state_s st_s;
  uint8_t *k_0;
  unsigned_long __vla_expr3;
  uint32_t input_len0;
  uint8_t *k__1;
  unsigned_long __vla_expr2;
  uint32_t input_len_1;
  uint32_t *ctr_1;
  uint8_t *v_1;
  uint8_t *k_1;
  Hacl_HMAC_DRBG_state scrut_1;
  unsigned_long __vla_expr1;
  char local_78;
  EverCrypt_DRBG_state_s st_s_1;
  _Bool result;
  _Bool ok;
  unsigned_long __vla_expr0;
  uint32_t entropy_input_len;
  _Bool ok0;
  uint32_t additional_input_len_local;
  uint8_t *additional_input_local;
  uint32_t n_local;
  EverCrypt_DRBG_state_s *st_local;
  uint8_t *output_local;
  
  if ((Hacl_HMAC_DRBG_max_additional_input_length < additional_input_len) ||
     (Hacl_HMAC_DRBG_max_output_length < n)) {
    output_local._7_1_ = false;
  }
  else {
    if (Hacl_HMAC_DRBG_max_additional_input_length < additional_input_len) {
      bVar5 = false;
    }
    else {
      auStack_250[0] = '$';
      auStack_250[1] = 0xe9;
      auStack_250[2] = '(';
      auStack_250[3] = '\0';
      auStack_250[4] = '\0';
      auStack_250[5] = '\0';
      auStack_250[6] = '\0';
      auStack_250[7] = '\0';
      len = Hacl_HMAC_DRBG_min_length('\x03');
      lVar3 = -((ulong)len + 0xf & 0xfffffffffffffff0);
      puVar23 = (uint8_t *)((long)&local_248 + lVar3);
      puVar10 = auStack_250 + lVar3;
      local_210 = puVar23;
      puVar10[0] = 0x8f;
      puVar10[1] = 0xe9;
      puVar10[2] = '(';
      puVar10[3] = '\0';
      puVar10[4] = '\0';
      puVar10[5] = '\0';
      puVar10[6] = '\0';
      puVar10[7] = '\0';
      memset(puVar23,0,(ulong)len);
      puVar21 = local_210;
      puVar11 = auStack_250 + lVar3;
      puVar11[0] = 0x9e;
      puVar11[1] = 0xe9;
      puVar11[2] = '(';
      puVar11[3] = '\0';
      puVar11[4] = '\0';
      puVar11[5] = '\0';
      puVar11[6] = '\0';
      puVar11[7] = '\0';
      _Var7 = Lib_RandomBuffer_System_randombytes(puVar21,len);
      if (_Var7) {
        uVar1 = *(undefined8 *)st;
        puVar21 = (st->field_1).case_SHA1_s.k;
        puVar22 = (st->field_1).case_SHA1_s.v;
        puVar2 = (st->field_1).case_SHA1_s.reseed_counter;
        puVar23 = puVar23 + -((ulong)(len + additional_input_len) + 0xf & 0xfffffffffffffff0);
        local_218 = puVar23;
        puVar23[-8] = 'N';
        puVar23[-7] = 0xea;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,(ulong)(len + additional_input_len));
        puVar6 = local_210;
        puVar19 = local_218;
        puVar23[-8] = 'j';
        puVar23[-7] = 0xea;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar19,puVar6,(ulong)len);
        puVar19 = local_218 + len;
        puVar23[-8] = 0x89;
        puVar23[-7] = 0xea;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar19,additional_input,(ulong)additional_input_len);
        local_78 = (char)uVar1;
        if (local_78 != '\x03') {
          puVar23[-8] = 0xd6;
          puVar23[-7] = 0xea;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          printf("KaRaMeL abort at %s:%d\n%s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
                 ,0x63f,"unreachable (pattern matches are exhaustive in F*)");
          puVar23[-8] = 0xe0;
          puVar23[-7] = 0xea;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          exit(0xff);
        }
        uVar8 = len + 0x41 + additional_input_len;
        puVar23 = puVar23 + -((ulong)uVar8 + 0xf & 0xfffffffffffffff0);
        local_220 = puVar23;
        puVar23[-8] = 0x88;
        puVar23[-7] = 0xeb;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,(ulong)uVar8);
        puVar19 = local_220;
        puVar23[-8] = 0xae;
        puVar23[-7] = 0xeb;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar19,puVar22,0x40);
        puVar6 = local_218;
        if (len + additional_input_len != 0) {
          puVar20 = local_220 + 0x41;
          puVar23[-8] = 0xde;
          puVar23[-7] = 0xeb;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          memcpy(puVar20,puVar6,(ulong)(len + additional_input_len));
        }
        puVar6 = local_220;
        local_220[0x40] = '\0';
        puVar23[-8] = '\b';
        puVar23[-7] = 0xec;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar19,puVar21,0x40,puVar6,uVar8);
        puVar23[-8] = '+';
        puVar23[-7] = 0xec;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,puVar19,0x40,puVar22,0x40);
        puVar23[-8] = 'C';
        puVar23[-7] = 0xec;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar21,puVar19,0x40);
        if (len + additional_input_len != 0) {
          uVar8 = len + 0x41 + additional_input_len;
          puVar23 = puVar23 + -((ulong)uVar8 + 0xf & 0xfffffffffffffff0);
          local_228 = puVar23;
          puVar23[-8] = 0xda;
          puVar23[-7] = 0xec;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          memset(puVar23,0,(ulong)uVar8);
          puVar19 = local_228;
          puVar23[-8] = '\0';
          puVar23[-7] = 0xed;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          memcpy(puVar19,puVar22,0x40);
          puVar6 = local_218;
          if (len + additional_input_len != 0) {
            puVar20 = local_228 + 0x41;
            puVar23[-8] = '0';
            puVar23[-7] = 0xed;
            puVar23[-6] = '(';
            puVar23[-5] = '\0';
            puVar23[-4] = '\0';
            puVar23[-3] = '\0';
            puVar23[-2] = '\0';
            puVar23[-1] = '\0';
            memcpy(puVar20,puVar6,(ulong)(len + additional_input_len));
          }
          puVar6 = local_228;
          local_228[0x40] = '\x01';
          puVar23[-8] = 'Z';
          puVar23[-7] = 0xed;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          EverCrypt_HMAC_compute_sha2_512(puVar19,puVar21,0x40,puVar6,uVar8);
          puVar23[-8] = '}';
          puVar23[-7] = 0xed;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          EverCrypt_HMAC_compute_sha2_512(puVar22,puVar19,0x40,puVar22,0x40);
          puVar23[-8] = 0x95;
          puVar23[-7] = 0xed;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          memcpy(puVar21,puVar19,0x40);
        }
        *puVar2 = 1;
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    }
    if (bVar5) {
      v = (st->field_1).case_SHA1_s.k;
      ctr = (uint32_t *)(st->field_1).case_SHA1_s.v;
      puStack_158 = (st->field_1).case_SHA1_s.reseed_counter;
      ite.reseed_counter._0_1_ = (char)*(undefined8 *)st;
      if ((char)ite.reseed_counter != '\x03') {
        auStack_250[0] = ']';
        auStack_250[1] = 0xee;
        auStack_250[2] = '(';
        auStack_250[3] = '\0';
        auStack_250[4] = '\0';
        auStack_250[5] = '\0';
        auStack_250[6] = '\0';
        auStack_250[7] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,0x678,"unreachable (pattern matches are exhaustive in F*)");
        auStack_250[0] = 'g';
        auStack_250[1] = 0xee;
        auStack_250[2] = '(';
        auStack_250[3] = '\0';
        auStack_250[4] = '\0';
        auStack_250[5] = '\0';
        auStack_250[6] = '\0';
        auStack_250[7] = '\0';
        exit(0xff);
      }
      if (Hacl_HMAC_DRBG_reseed_interval < *puStack_158) {
        output_local._7_1_ = false;
      }
      else {
        ppuVar18 = &local_248;
        k = v;
        scrut.k = (uint8_t *)ctr;
        scrut.v = (uint8_t *)puStack_158;
        scrut.reseed_counter = (uint32_t *)v;
        if (additional_input_len != 0) {
          local_15c = additional_input_len + 0x41;
          k__2 = (uint8_t *)(ulong)local_15c;
          lVar3 = -((ulong)(k__2 + 0xf) & 0xfffffffffffffff0);
          puVar23 = (uint8_t *)((long)&local_248 + lVar3);
          uVar9 = (ulong)local_15c;
          puVar12 = auStack_250 + lVar3;
          local_230 = puVar23;
          __vla_expr4 = (unsigned_long)&local_248;
          puVar12[0] = 0x9e;
          puVar12[1] = 0xef;
          puVar12[2] = '(';
          puVar12[3] = '\0';
          puVar12[4] = '\0';
          puVar12[5] = '\0';
          puVar12[6] = '\0';
          puVar12[7] = '\0';
          memset(puVar23,0,uVar9);
          puVar2 = ctr;
          puVar21 = local_230;
          puStack_178 = local_230;
          puVar13 = auStack_250 + lVar3;
          puVar13[0] = 0xc4;
          puVar13[1] = 0xef;
          puVar13[2] = '(';
          puVar13[3] = '\0';
          puVar13[4] = '\0';
          puVar13[5] = '\0';
          puVar13[6] = '\0';
          puVar13[7] = '\0';
          memcpy(puVar21,puVar2,0x40);
          if (additional_input_len != 0) {
            puVar21 = local_230 + 0x41;
            puVar14 = auStack_250 + lVar3;
            puVar14[0] = 0xe7;
            puVar14[1] = 0xef;
            puVar14[2] = '(';
            puVar14[3] = '\0';
            puVar14[4] = '\0';
            puVar14[5] = '\0';
            puVar14[6] = '\0';
            puVar14[7] = '\0';
            memcpy(puVar21,additional_input,(ulong)additional_input_len);
          }
          puVar21 = local_230;
          local_230[0x40] = '\0';
          puVar19 = v;
          uVar8 = local_15c;
          puVar22 = puStack_178;
          puVar15 = auStack_250 + lVar3;
          puVar15[0] = '\x11';
          puVar15[1] = 0xf0;
          puVar15[2] = '(';
          puVar15[3] = '\0';
          puVar15[4] = '\0';
          puVar15[5] = '\0';
          puVar15[6] = '\0';
          puVar15[7] = '\0';
          EverCrypt_HMAC_compute_sha2_512(puVar22,puVar19,0x40,puVar21,uVar8);
          puVar2 = ctr;
          puVar21 = puStack_178;
          puVar16 = auStack_250 + lVar3;
          puVar16[0] = '4';
          puVar16[1] = 0xf0;
          puVar16[2] = '(';
          puVar16[3] = '\0';
          puVar16[4] = '\0';
          puVar16[5] = '\0';
          puVar16[6] = '\0';
          puVar16[7] = '\0';
          EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar21,0x40,(uint8_t *)puVar2,0x40);
          puVar22 = v;
          puVar21 = puStack_178;
          puVar17 = auStack_250 + lVar3;
          puVar17[0] = 'L';
          puVar17[1] = 0xf0;
          puVar17[2] = '(';
          puVar17[3] = '\0';
          puVar17[4] = '\0';
          puVar17[5] = '\0';
          puVar17[6] = '\0';
          puVar17[7] = '\0';
          memcpy(puVar22,puVar21,0x40);
          ppuVar18 = (uint8_t **)__vla_expr4;
          if (additional_input_len != 0) {
            local_17c = additional_input_len + 0x41;
            k_0_1 = (uint8_t *)(ulong)local_17c;
            puVar22 = puVar23 + -((ulong)(k_0_1 + 0xf) & 0xfffffffffffffff0);
            uVar9 = (ulong)local_17c;
            local_238 = puVar22;
            __vla_expr5 = (unsigned_long)puVar23;
            puVar22[-8] = 0xdb;
            puVar22[-7] = 0xf0;
            puVar22[-6] = '(';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            memset(puVar22,0,uVar9);
            puVar2 = ctr;
            puVar21 = local_238;
            output1 = local_238;
            puVar22[-8] = '\x01';
            puVar22[-7] = 0xf1;
            puVar22[-6] = '(';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            memcpy(puVar21,puVar2,0x40);
            if (additional_input_len != 0) {
              puVar21 = local_238 + 0x41;
              puVar22[-8] = '$';
              puVar22[-7] = 0xf1;
              puVar22[-6] = '(';
              puVar22[-5] = '\0';
              puVar22[-4] = '\0';
              puVar22[-3] = '\0';
              puVar22[-2] = '\0';
              puVar22[-1] = '\0';
              memcpy(puVar21,additional_input,(ulong)additional_input_len);
            }
            puVar21 = local_238;
            local_238[0x40] = '\x01';
            puVar19 = v;
            uVar8 = local_17c;
            puVar23 = output1;
            puVar22[-8] = 'N';
            puVar22[-7] = 0xf1;
            puVar22[-6] = '(';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512(puVar23,puVar19,0x40,puVar21,uVar8);
            puVar2 = ctr;
            puVar21 = output1;
            puVar22[-8] = 'q';
            puVar22[-7] = 0xf1;
            puVar22[-6] = '(';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar21,0x40,(uint8_t *)puVar2,0x40);
            puVar23 = v;
            puVar21 = output1;
            puVar22[-8] = 0x89;
            puVar22[-7] = 0xf1;
            puVar22[-6] = '(';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            memcpy(puVar23,puVar21,0x40);
            ppuVar18 = (uint8_t **)__vla_expr4;
          }
        }
        out._4_4_ = n >> 6;
        puStack_1b0 = output;
        puStack_1a0 = output;
        for (block._4_4_ = 0; puVar21 = v, puVar2 = ctr, block._4_4_ < out._4_4_;
            block._4_4_ = block._4_4_ + 1) {
          *(undefined8 *)((long)ppuVar18 + -8) = 0x28f1fd;
          EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar21,0x40,(uint8_t *)puVar2,0x40);
          puVar2 = ctr;
          puVar21 = puStack_1b0 + (block._4_4_ << 6);
          *(undefined8 *)((long)ppuVar18 + -8) = 0x28f223;
          memcpy(puVar21,puVar2,0x40);
        }
        if (out._4_4_ << 6 < n) {
          puStack_1c0 = puStack_1a0 + (out._4_4_ << 6);
          *(undefined8 *)((long)ppuVar18 + -8) = 0x28f281;
          EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar21,0x40,(uint8_t *)puVar2,0x40);
          puVar2 = ctr;
          puVar21 = puStack_1c0;
          iVar4 = out._4_4_ * -0x40;
          *(undefined8 *)((long)ppuVar18 + -8) = 0x28f2aa;
          memcpy(puVar21,puVar2,(ulong)(n + iVar4));
        }
        local_1c4 = additional_input_len + 0x41;
        k_ = (uint8_t *)(ulong)local_1c4;
        puVar23 = (uint8_t *)((long)ppuVar18 + -((ulong)(k_ + 0xf) & 0xfffffffffffffff0));
        uVar9 = (ulong)local_1c4;
        local_240 = puVar23;
        __vla_expr6 = (unsigned_long)ppuVar18;
        puVar23[-8] = '-';
        puVar23[-7] = 0xf3;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,uVar9);
        puVar2 = ctr;
        puVar21 = local_240;
        puStack_1e0 = local_240;
        puVar23[-8] = 'S';
        puVar23[-7] = 0xf3;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar21,puVar2,0x40);
        if (additional_input_len != 0) {
          puVar21 = local_240 + 0x41;
          puVar23[-8] = 'v';
          puVar23[-7] = 0xf3;
          puVar23[-6] = '(';
          puVar23[-5] = '\0';
          puVar23[-4] = '\0';
          puVar23[-3] = '\0';
          puVar23[-2] = '\0';
          puVar23[-1] = '\0';
          memcpy(puVar21,additional_input,(ulong)additional_input_len);
        }
        puVar21 = local_240;
        local_240[0x40] = '\0';
        puVar19 = v;
        uVar8 = local_1c4;
        puVar22 = puStack_1e0;
        puVar23[-8] = 0xa0;
        puVar23[-7] = 0xf3;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,puVar19,0x40,puVar21,uVar8);
        puVar2 = ctr;
        puVar21 = puStack_1e0;
        puVar23[-8] = 0xc3;
        puVar23[-7] = 0xf3;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar21,0x40,(uint8_t *)puVar2,0x40);
        puVar22 = v;
        puVar21 = puStack_1e0;
        puVar23[-8] = 0xdb;
        puVar23[-7] = 0xf3;
        puVar23[-6] = '(';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar22,puVar21,0x40);
        if (additional_input_len != 0) {
          local_1e4 = additional_input_len + 0x41;
          k_0_2 = (uint8_t *)(ulong)local_1e4;
          puVar22 = puVar23 + -((ulong)(k_0_2 + 0xf) & 0xfffffffffffffff0);
          uVar9 = (ulong)local_1e4;
          local_248 = puVar22;
          __vla_expr7 = (unsigned_long)puVar23;
          puVar22[-8] = 'j';
          puVar22[-7] = 0xf4;
          puVar22[-6] = '(';
          puVar22[-5] = '\0';
          puVar22[-4] = '\0';
          puVar22[-3] = '\0';
          puVar22[-2] = '\0';
          puVar22[-1] = '\0';
          memset(puVar22,0,uVar9);
          puVar2 = ctr;
          puVar21 = local_248;
          puStack_200 = local_248;
          puVar22[-8] = 0x90;
          puVar22[-7] = 0xf4;
          puVar22[-6] = '(';
          puVar22[-5] = '\0';
          puVar22[-4] = '\0';
          puVar22[-3] = '\0';
          puVar22[-2] = '\0';
          puVar22[-1] = '\0';
          memcpy(puVar21,puVar2,0x40);
          if (additional_input_len != 0) {
            puVar21 = local_248 + 0x41;
            puVar22[-8] = 0xb3;
            puVar22[-7] = 0xf4;
            puVar22[-6] = '(';
            puVar22[-5] = '\0';
            puVar22[-4] = '\0';
            puVar22[-3] = '\0';
            puVar22[-2] = '\0';
            puVar22[-1] = '\0';
            memcpy(puVar21,additional_input,(ulong)additional_input_len);
          }
          puVar21 = local_248;
          local_248[0x40] = '\x01';
          puVar19 = v;
          uVar8 = local_1e4;
          puVar23 = puStack_200;
          puVar22[-8] = 0xdd;
          puVar22[-7] = 0xf4;
          puVar22[-6] = '(';
          puVar22[-5] = '\0';
          puVar22[-4] = '\0';
          puVar22[-3] = '\0';
          puVar22[-2] = '\0';
          puVar22[-1] = '\0';
          EverCrypt_HMAC_compute_sha2_512(puVar23,puVar19,0x40,puVar21,uVar8);
          puVar2 = ctr;
          puVar21 = puStack_200;
          puVar22[-8] = '\0';
          puVar22[-7] = 0xf5;
          puVar22[-6] = '(';
          puVar22[-5] = '\0';
          puVar22[-4] = '\0';
          puVar22[-3] = '\0';
          puVar22[-2] = '\0';
          puVar22[-1] = '\0';
          EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar21,0x40,(uint8_t *)puVar2,0x40);
          puVar23 = v;
          puVar21 = puStack_200;
          puVar22[-8] = '\x18';
          puVar22[-7] = 0xf5;
          puVar22[-6] = '(';
          puVar22[-5] = '\0';
          puVar22[-4] = '\0';
          puVar22[-3] = '\0';
          puVar22[-2] = '\0';
          puVar22[-1] = '\0';
          memcpy(puVar23,puVar21,0x40);
        }
        *puStack_158 = *puStack_158 + 1;
        output_local._7_1_ = true;
      }
    }
    else {
      output_local._7_1_ = false;
    }
  }
  return output_local._7_1_;
}

Assistant:

static bool
generate_sha2_512(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  if
  (
    additional_input_len
    > Hacl_HMAC_DRBG_max_additional_input_length
    || n > Hacl_HMAC_DRBG_max_output_length
  )
  {
    return false;
  }
  bool ok0;
  if (additional_input_len > Hacl_HMAC_DRBG_max_additional_input_length)
  {
    ok0 = false;
  }
  else
  {
    uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512);
    KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len);
    uint8_t entropy_input[entropy_input_len];
    memset(entropy_input, 0U, entropy_input_len * sizeof (uint8_t));
    bool ok = Lib_RandomBuffer_System_randombytes(entropy_input, entropy_input_len);
    bool result;
    if (!ok)
    {
      result = false;
    }
    else
    {
      EverCrypt_DRBG_state_s st_s = *st;
      KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + additional_input_len);
      uint8_t seed_material[entropy_input_len + additional_input_len];
      memset(seed_material, 0U, (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
      memcpy(seed_material + entropy_input_len,
        additional_input,
        additional_input_len * sizeof (uint8_t));
      Hacl_HMAC_DRBG_state scrut;
      if (st_s.tag == SHA2_512_s)
      {
        scrut = st_s.case_SHA2_512_s;
      }
      else
      {
        scrut =
          KRML_EABORT(Hacl_HMAC_DRBG_state,
            "unreachable (pattern matches are exhaustive in F*)");
      }
      uint8_t *k = scrut.k;
      uint8_t *v = scrut.v;
      uint32_t *ctr = scrut.reseed_counter;
      uint32_t input_len = 65U + entropy_input_len + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
      uint8_t input0[input_len];
      memset(input0, 0U, input_len * sizeof (uint8_t));
      uint8_t *k_ = input0;
      memcpy(k_, v, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        memcpy(input0 + 65U,
          seed_material,
          (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      }
      input0[64U] = 0U;
      EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
      EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
      memcpy(k, k_, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        uint32_t input_len0 = 65U + entropy_input_len + additional_input_len;
        KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
        uint8_t input[input_len0];
        memset(input, 0U, input_len0 * sizeof (uint8_t));
        uint8_t *k_0 = input;
        memcpy(k_0, v, 64U * sizeof (uint8_t));
        if (entropy_input_len + additional_input_len != 0U)
        {
          memcpy(input + 65U,
            seed_material,
            (entropy_input_len + additional_input_len) * sizeof (uint8_t));
        }
        input[64U] = 1U;
        EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
        EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
        memcpy(k, k_0, 64U * sizeof (uint8_t));
      }
      ctr[0U] = 1U;
      result = true;
    }
    ok0 = result;
  }
  if (!ok0)
  {
    return false;
  }
  EverCrypt_DRBG_state_s st_s = *st;
  Hacl_HMAC_DRBG_state ite;
  if (st_s.tag == SHA2_512_s)
  {
    ite = st_s.case_SHA2_512_s;
  }
  else
  {
    ite = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  if (ite.reseed_counter[0U] > Hacl_HMAC_DRBG_reseed_interval)
  {
    return false;
  }
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA2_512_s)
  {
    scrut = st_s.case_SHA2_512_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  if (additional_input_len > 0U)
  {
    uint32_t input_len = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
    uint8_t input0[input_len];
    memset(input0, 0U, input_len * sizeof (uint8_t));
    uint8_t *k_ = input0;
    memcpy(k_, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input0[64U] = 0U;
    EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
    EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
    memcpy(k, k_, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      uint32_t input_len0 = 65U + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
      uint8_t input[input_len0];
      memset(input, 0U, input_len0 * sizeof (uint8_t));
      uint8_t *k_0 = input;
      memcpy(k_0, v, 64U * sizeof (uint8_t));
      if (additional_input_len != 0U)
      {
        memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
      }
      input[64U] = 1U;
      EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
      EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
      memcpy(k, k_0, 64U * sizeof (uint8_t));
    }
  }
  uint8_t *output1 = output;
  uint32_t max = n / 64U;
  uint8_t *out = output1;
  for (uint32_t i = 0U; i < max; i++)
  {
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(out + i * 64U, v, 64U * sizeof (uint8_t));
  }
  if (max * 64U < n)
  {
    uint8_t *block = output1 + max * 64U;
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(block, v, (n - max * 64U) * sizeof (uint8_t));
  }
  uint32_t input_len = 65U + additional_input_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
  }
  input0[64U] = 0U;
  EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
  EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
  memcpy(k, k_, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    uint32_t input_len0 = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input[64U] = 1U;
    EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
    EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
    memcpy(k, k_0, 64U * sizeof (uint8_t));
  }
  uint32_t old_ctr = ctr[0U];
  ctr[0U] = old_ctr + 1U;
  return true;
}